

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::rtrim(CBString *this,CBString *b)

{
  int iVar1;
  int l;
  CBString *b_local;
  CBString *this_local;
  
  iVar1 = nreversefindchr(this,b,(this->super_tagbstring).slen + -1);
  (this->super_tagbstring).slen = iVar1 + 1;
  if ((this->super_tagbstring).slen < (this->super_tagbstring).mlen) {
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

void CBString::rtrim (const CBString& b) {
	int l = nreversefindchr (b, slen - 1);
#if BSTR_ERR != -1
	if (l == BSTR_ERR) l = -1;
#endif
	slen = l + 1;
	if (mlen > slen) data[slen] = '\0';
}